

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::ComputeArguments(cmCTestRunTest *this)

{
  cmCTestTestHandler *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  char *pcVar4;
  reference this_00;
  reference pbVar5;
  void *this_01;
  ostream *poVar6;
  size_type sVar7;
  reference pbVar8;
  undefined1 auVar9 [16];
  string local_590 [32];
  ostringstream local_570 [8];
  ostringstream cmCTestLog_msg_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  const_iterator e;
  ostringstream local_3c0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_248 [32];
  ostringstream local_228 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  iterator i;
  undefined1 local_88 [8];
  string testCommand;
  string local_48;
  cmCTestTestHandler *local_28;
  cmCTestMemCheckHandler *handler;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  const_iterator j;
  cmCTestRunTest *this_local;
  
  j._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Arguments);
  handler = (cmCTestMemCheckHandler *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->TestProperties->Args);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_18,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&handler);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_18);
  if ((this->TestHandler->MemCheck & 1U) == 0) {
    pcVar1 = this->TestHandler;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->TestProperties->Args,1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_
              ((string *)((long)&testCommand.field_2 + 8),pcVar1,pcVar4);
    std::__cxx11::string::operator=
              ((string *)&this->ActualCommand,(string *)(testCommand.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(testCommand.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_18);
  }
  else {
    local_28 = this->TestHandler;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->ActualCommand,pcVar4);
    pcVar1 = this->TestHandler;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->TestProperties->Args,1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_(&local_48,pcVar1,pcVar4);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->TestProperties->Args,1);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  auVar9 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_88,auVar9._0_8_,auVar9._8_8_);
  (*(this->TestHandler->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[10])
            (this->TestHandler,&this->Arguments,(ulong)(uint)this->Index);
  local_a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Arguments);
  while( true ) {
    local_a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Arguments);
    bVar3 = __gnu_cxx::operator!=(&local_a0,&local_a8);
    if (!bVar3) break;
    std::__cxx11::string::operator+=((string *)local_88," \"");
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_a0);
    std::__cxx11::string::operator+=((string *)local_88,(string *)pbVar5);
    std::__cxx11::string::operator+=((string *)local_88,"\"");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_a0);
  }
  while( true ) {
    local_b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->TestProperties->Args);
    bVar3 = __gnu_cxx::operator!=(&local_18,&local_b0);
    if (!bVar3) break;
    std::__cxx11::string::operator+=((string *)local_88," \"");
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_18);
    std::__cxx11::string::operator+=((string *)local_88,(string *)pbVar8);
    std::__cxx11::string::operator+=((string *)local_88,"\"");
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Arguments,pbVar8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_18);
  }
  std::__cxx11::string::operator=((string *)&(this->TestResult).FullCommandLine,(string *)local_88);
  std::__cxx11::ostringstream::ostringstream(local_228);
  this_01 = (void *)std::ostream::operator<<(local_228,std::endl<char,std::char_traits<char>>);
  poVar6 = (ostream *)std::ostream::operator<<(this_01,this->Index);
  poVar6 = std::operator<<(poVar6,": ");
  pcVar4 = "Test";
  if ((this->TestHandler->MemCheck & 1U) != 0) {
    pcVar4 = "MemCheck";
  }
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," command: ");
  poVar6 = std::operator<<(poVar6,(string *)local_88);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar2 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x248,pcVar4,false);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->TestProperties->Environment);
  if (sVar7 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_3c0);
    poVar6 = (ostream *)std::ostream::operator<<(local_3c0,this->Index);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = std::operator<<(poVar6,"Environment variables: ");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x24e,pcVar4,false);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::ostringstream::~ostringstream(local_3c0);
  }
  local_3f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->TestProperties->Environment);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_3e8,&local_3f0);
  while( true ) {
    local_3f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->TestProperties->Environment);
    bVar3 = __gnu_cxx::operator!=(&local_3e8,&local_3f8);
    if (!bVar3) break;
    std::__cxx11::ostringstream::ostringstream(local_570);
    poVar6 = (ostream *)std::ostream::operator<<(local_570,this->Index);
    poVar6 = std::operator<<(poVar6,":  ");
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_3e8);
    poVar6 = std::operator<<(poVar6,(string *)pbVar8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x255,pcVar4,false);
    std::__cxx11::string::~string(local_590);
    std::__cxx11::ostringstream::~ostringstream(local_570);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3e8);
  }
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void cmCTestRunTest::ComputeArguments()
{
  this->Arguments.clear(); // reset becaue this might be a rerun
  std::vector<std::string>::const_iterator j =
    this->TestProperties->Args.begin();
  ++j; // skip test name
  // find the test executable
  if(this->TestHandler->MemCheck)
    {
    cmCTestMemCheckHandler * handler = static_cast<cmCTestMemCheckHandler*>
      (this->TestHandler);
    this->ActualCommand = handler->MemoryTester.c_str();
    this->TestProperties->Args[1] = this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    }
  else
    {
    this->ActualCommand =
      this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    ++j; //skip the executable (it will be actualCommand)
    }
  std::string testCommand
    = cmSystemTools::ConvertToOutputPath(this->ActualCommand.c_str());

  //Prepends memcheck args to our command string
  this->TestHandler->GenerateTestCommand(this->Arguments, this->Index);
  for(std::vector<std::string>::iterator i = this->Arguments.begin();
      i != this->Arguments.end(); ++i)
    {
    testCommand += " \"";
    testCommand += *i;
    testCommand += "\"";
    }

  for(;j != this->TestProperties->Args.end(); ++j)
    {
    testCommand += " \"";
    testCommand += *j;
    testCommand += "\"";
    this->Arguments.push_back(*j);
    }
  this->TestResult.FullCommandLine = testCommand;

  // Print the test command in verbose mode
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
             << this->Index << ": "
             << (this->TestHandler->MemCheck?"MemCheck":"Test")
             << " command: " << testCommand
             << std::endl);

  // Print any test-specific env vars in verbose mode
  if (this->TestProperties->Environment.size())
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ": "
               << "Environment variables: " << std::endl);
    }
  for(std::vector<std::string>::const_iterator e =
      this->TestProperties->Environment.begin();
      e != this->TestProperties->Environment.end(); ++e)
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ":  " << *e
               << std::endl);
    }
}